

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_get_bytes_per_sample(ma_format format)

{
  ma_uint32 sizes [6];
  ma_format format_local;
  
  sizes[0] = 0;
  sizes[1] = 1;
  sizes[2] = 2;
  sizes[3] = 3;
  sizes[4] = 4;
  sizes[5] = 4;
  return sizes[format];
}

Assistant:

MA_API ma_uint32 ma_get_bytes_per_sample(ma_format format)
{
    ma_uint32 sizes[] = {
        0,  /* unknown */
        1,  /* u8 */
        2,  /* s16 */
        3,  /* s24 */
        4,  /* s32 */
        4,  /* f32 */
    };
    return sizes[format];
}